

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OtherVisitor.cpp
# Opt level: O1

void __thiscall OpenMD::WrappingVisitor::internalVisit(WrappingVisitor *this,StuntDouble *sd)

{
  long *plVar1;
  double *pdVar2;
  long *plVar3;
  double *pdVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  uint i;
  long lVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  long lVar7;
  Vector3d *pVVar8;
  double *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  double local_68;
  Vector3d local_58;
  Snapshot *local_38;
  
  pdVar2 = local_58.super_Vector<double,_3U>.data_ + 2;
  local_58.super_Vector<double,_3U>.data_[0] = (double)pdVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"ATOMDATA","");
  StuntDouble::getPropertyByName((StuntDouble *)&local_78,(string *)sd);
  this_00 = p_Stack_70;
  pdVar4 = local_78;
  p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_78 = (double *)0x0;
  if ((double *)local_58.super_Vector<double,_3U>.data_[0] != pdVar2) {
    operator_delete((void *)local_58.super_Vector<double,_3U>.data_[0],
                    (long)local_58.super_Vector<double,_3U>.data_[2] + 1);
  }
  if ((_func_int **)pdVar4 == (_func_int **)0x0) {
    this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    lVar5 = __dynamic_cast(pdVar4,&GenericData::typeinfo,&AtomData::typeinfo,0);
    this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar7 = 0;
    if ((lVar5 != 0) &&
       (this_01 = this_00, lVar7 = lVar5,
       this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    if (lVar7 != 0) {
      local_38 = this->info->sman_->currentSnapshot_;
      plVar3 = *(long **)(lVar7 + 0x28);
      if (plVar3 == *(long **)(lVar7 + 0x30)) {
        lVar5 = 0;
        p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        lVar5 = *plVar3;
        p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar3[1];
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          }
        }
      }
      while (this_02 = p_Var6, lVar5 != 0) {
        pVVar8 = (Vector3d *)(lVar5 + 0x28);
        local_78 = (double *)0x0;
        p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_68 = 0.0;
        lVar5 = 0;
        do {
          (&local_78)[lVar5] =
               (double *)
               ((pVVar8->super_Vector<double,_3U>).data_[lVar5] -
               (this->origin_).super_Vector<double,_3U>.data_[lVar5]);
          lVar5 = lVar5 + 1;
        } while (lVar5 != 3);
        local_58.super_Vector<double,_3U>.data_[2] = local_68;
        local_58.super_Vector<double,_3U>.data_[0] = (double)local_78;
        local_58.super_Vector<double,_3U>.data_[1] = (double)p_Stack_70;
        Snapshot::wrapVector(local_38,&local_58);
        if (pVVar8 != &local_58) {
          lVar5 = 0;
          do {
            (pVVar8->super_Vector<double,_3U>).data_[lVar5] =
                 local_58.super_Vector<double,_3U>.data_[lVar5];
            lVar5 = lVar5 + 1;
          } while (lVar5 != 3);
        }
        plVar1 = plVar3 + 2;
        if (plVar1 == *(long **)(lVar7 + 0x30)) {
          lVar5 = 0;
          p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        else {
          lVar5 = plVar3[2];
          p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar3[3];
          if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            }
          }
        }
        plVar3 = plVar1;
        if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
        }
      }
      goto LAB_0021dc62;
    }
  }
  this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_0021dc62:
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void WrappingVisitor::internalVisit(StuntDouble* sd) {
    std::shared_ptr<GenericData> data;
    std::shared_ptr<AtomData> atomData;
    std::shared_ptr<AtomInfo> atomInfo;
    std::vector<std::shared_ptr<AtomInfo>>::iterator i;

    data = sd->getPropertyByName("ATOMDATA");

    if (data != nullptr) {
      atomData = std::dynamic_pointer_cast<AtomData>(data);

      if (atomData == nullptr) return;
    } else
      return;

    Snapshot* currSnapshot = info->getSnapshotManager()->getCurrentSnapshot();

    for (atomInfo = atomData->beginAtomInfo(i); atomInfo;
         atomInfo = atomData->nextAtomInfo(i)) {
      Vector3d newPos = atomInfo->pos - origin_;
      currSnapshot->wrapVector(newPos);
      atomInfo->pos = newPos;
    }
  }